

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubBoard.cpp
# Opt level: O0

Chunk * __thiscall SubBoard::accessChunk(SubBoard *this,repr coords)

{
  format_string_t<std::pair<int,_int>_> fmt;
  bool bVar1;
  tuple<LodRenderer_*&&,_unsigned_long_&> *__args_2;
  pointer ppVar2;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false>,_bool>
  pVar3;
  iterator chunk;
  Chunk *in_stack_ffffffffffffff38;
  pair<int,_int> *in_stack_ffffffffffffff40;
  ChunkDrawable *this_00;
  char *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  tuple<unsigned_long_&> *__args_1;
  piecewise_construct_t *__args;
  unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
  *in_stack_ffffffffffffff60;
  piecewise_construct_t local_78 [8];
  unsigned_long *in_stack_ffffffffffffff90;
  _Head_base<0UL,_unsigned_long_&,_false> in_stack_ffffffffffffff98;
  undefined1 local_48 [16];
  _Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false> local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false> local_30;
  Drawable local_18;
  char *local_10;
  pointer local_8;
  
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
       ::find((unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
               *)in_stack_ffffffffffffff38,(key_type *)0x20a325);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
       ::end((unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
              *)in_stack_ffffffffffffff38);
  bVar1 = std::__detail::operator!=(&local_30,&local_38);
  if (bVar1) {
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false> *)
                        0x20a36b);
  }
  else {
    local_8 = (pointer)local_48;
    local_10 = "SubBoard allocating new chunk at {}.";
    ::fmt::v11::basic_string_view<char>::basic_string_view
              ((basic_string_view<char> *)local_8,"SubBoard allocating new chunk at {}.",0x24);
    ChunkCoords::toPair((repr)in_stack_ffffffffffffff38);
    fmt.str.size_ = in_stack_ffffffffffffff50;
    fmt.str.data_ = in_stack_ffffffffffffff48;
    spdlog::warn<std::pair<int,int>>(fmt,in_stack_ffffffffffffff40);
    __args_2 = (tuple<LodRenderer_*&&,_unsigned_long_&> *)(in_RDI + 0x50);
    __args_1 = (tuple<unsigned_long_&> *)&stack0xffffffffffffff98;
    this_00 = (ChunkDrawable *)&stack0xffffffffffffffd8;
    std::forward_as_tuple<unsigned_long&>((unsigned_long *)in_stack_ffffffffffffff38);
    __args = local_78;
    std::forward_as_tuple<LodRenderer*,unsigned_long&>
              ((LodRenderer **)__args_2,(unsigned_long *)this_00);
    pVar3 = std::
            unordered_map<unsigned_long,Chunk,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,Chunk>>>
            ::
            emplace<std::piecewise_construct_t_const&,std::tuple<unsigned_long&>,std::tuple<LodRenderer*&&,unsigned_long&>>
                      (in_stack_ffffffffffffff60,__args,__args_1,__args_2);
    local_30._M_cur =
         (__node_type *)
         pVar3.first.super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>._M_cur;
    FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::operator[]
              ((FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *)
               in_stack_ffffffffffffff98._M_head_impl,in_stack_ffffffffffffff90);
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false>::operator->
              ((_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false> *)0x20a4a0);
    ChunkDrawable::setChunk(this_00,in_stack_ffffffffffffff38);
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_Chunk>,_false,_false> *)
                        0x20a4be);
  }
  local_18._vptr_Drawable = (_func_int **)&ppVar2->second;
  return (Chunk *)local_18._vptr_Drawable;
}

Assistant:

Chunk& SubBoard::accessChunk(ChunkCoords::repr coords) {
    auto chunk = chunks_.find(coords);
    if (chunk != chunks_.end()) {
        return chunk->second;
    }

    spdlog::warn("SubBoard allocating new chunk at {}.", ChunkCoords::toPair(coords));
    chunk = chunks_.emplace(std::piecewise_construct, std::forward_as_tuple(coords), std::forward_as_tuple(static_cast<LodRenderer*>(this), coords)).first;
    chunkDrawables_[coords].setChunk(&chunk->second);
    return chunk->second;
}